

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline.cpp
# Opt level: O0

bool __thiscall CMU462::Timeline::step(Timeline *this)

{
  Timeline *this_local;
  
  if ((this->isPlaying & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else if ((this->isLooping & 1U) == 0) {
    if (this->current_frame < this->max_frame) {
      this->current_frame = this->current_frame + 1;
      this_local._7_1_ = true;
    }
    else {
      this->current_frame = this->max_frame;
      this->isPlaying = false;
      this_local._7_1_ = false;
    }
  }
  else {
    this->current_frame = (this->current_frame + 1) % (this->max_frame + 1);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Timeline::step() // Update function.
  {

	if(!isPlaying)
	{
	  return false;
	}

	if(isLooping)
	{
	  current_frame = (current_frame + 1) % (max_frame + 1);
	  return true;
	}

	if(current_frame >= max_frame)
	{
	  current_frame = max_frame;
	  isPlaying = false;
	  return false;
	}

	current_frame++;
	return true;
  }